

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O0

void __thiscall trento::Collider::Collider(Collider *this,VarMap *var_map)

{
  bool bVar1;
  int *piVar2;
  byte *pbVar3;
  bool *pbVar4;
  VarMap *var_map_00;
  NucleonCommon *nc;
  type A;
  variable_value *__sd;
  long *plVar5;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_RSI;
  long in_RDI;
  double dVar6;
  VarMap *in_stack_00000058;
  NucleonCommon *in_stack_00000060;
  VarMap *in_stack_000000b8;
  Event *in_stack_000000c0;
  long seed;
  string *in_stack_fffffffffffffe08;
  long lVar7;
  variables_map *in_stack_fffffffffffffe10;
  Nucleus *in_stack_fffffffffffffe20;
  Nucleus *in_stack_fffffffffffffe28;
  allocator *paVar8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *B;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  int iVar9;
  VarMap *in_stack_fffffffffffffed8;
  allocator local_c1;
  string local_c0 [32];
  long local_a0;
  allocator local_91;
  string local_90 [39];
  allocator local_69;
  string local_68 [39];
  allocator local_41;
  string local_40 [48];
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *local_10;
  
  local_10 = in_RSI;
  anon_unknown_6::create_nucleus
            (in_stack_fffffffffffffed8,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
            );
  anon_unknown_6::create_nucleus
            (in_stack_fffffffffffffed8,CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
            );
  NucleonCommon::NucleonCommon(in_stack_00000060,in_stack_00000058);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"number-events",&local_41);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  piVar2 = boost::program_options::variable_value::as<int>((variable_value *)0x129453);
  iVar9 = *piVar2;
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(int *)(in_RDI + 0xf0) = iVar9;
  pbVar3 = (byte *)(in_RDI + 0xf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"ncoll",&local_69);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  pbVar4 = boost::program_options::variable_value::as<bool>((variable_value *)0x12951e);
  bVar1 = *pbVar4;
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  *pbVar3 = bVar1 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"b-min",&local_91);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  var_map_00 = (VarMap *)
               boost::program_options::variable_value::as<double>((variable_value *)0x1295ec);
  dVar6 = *(double *)var_map_00;
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  *(double *)(in_RDI + 0xf8) = dVar6;
  nc = (NucleonCommon *)(in_RDI + 0x100);
  B = local_10;
  A = std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
                ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
                 in_stack_fffffffffffffe10);
  std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
            ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
             in_stack_fffffffffffffe10);
  dVar6 = anon_unknown_6::determine_bmax(var_map_00,A,(Nucleus *)B,nc);
  (nc->fast_exp_).xmin_ = dVar6;
  std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
            ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
             in_stack_fffffffffffffe10);
  std::unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_>::operator*
            ((unique_ptr<trento::Nucleus,_std::default_delete<trento::Nucleus>_> *)
             in_stack_fffffffffffffe10);
  dVar6 = anon_unknown_6::determine_asym(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  *(double *)(in_RDI + 0x108) = dVar6;
  Event::Event(in_stack_000000c0,in_stack_000000b8);
  Output::Output((Output *)in_stack_00000060,in_stack_00000058);
  paVar8 = &local_c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"random-seed",paVar8);
  __sd = boost::program_options::variables_map::operator[]
                   (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  plVar5 = boost::program_options::variable_value::as<long>((variable_value *)0x1297bb);
  lVar7 = *plVar5;
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  if (0 < lVar7) {
    local_a0 = lVar7;
    std::
    mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
    ::seed(local_10,(result_type)__sd);
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_common_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      calc_ncoll_(var_map["ncoll"].as<bool>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_common_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}